

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O1

void __thiscall bgui::BaseWindow::sendClose(BaseWindow *this)

{
  BaseWindowData *pBVar1;
  XEvent event;
  undefined4 local_d8 [6];
  Display *local_c0;
  Window local_b8;
  Atom local_b0;
  undefined4 local_a8;
  Atom local_a0;
  
  if (this->p->running == true) {
    pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
    pBVar1 = this->p;
    if (pBVar1->display != (Display *)0x0) {
      memset(local_d8,0,0xc0);
      local_d8[0] = 0x21;
      local_c0 = pBVar1->display;
      local_b8 = pBVar1->window;
      local_b0 = pBVar1->wm_delete_window;
      local_a8 = 0x20;
      local_a0 = pBVar1->wm_delete_window;
      XSendEvent(pBVar1->display,pBVar1->window,0,0,local_d8);
      XFlush(this->p->display);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->p->mutex);
  }
  return;
}

Assistant:

void BaseWindow::sendClose()
{
  XEvent event;

  if (p->running)
  {
    pthread_mutex_lock(&(p->mutex));

    // request to close the window

    if (p->display != NULL)
    {
      memset(&event, 0, sizeof(XEvent));
      event.type=ClientMessage;
      event.xclient.display=p->display;
      event.xclient.window=p->window;
      event.xclient.message_type=p->wm_delete_window;
      event.xclient.format=32;
      event.xclient.data.l[0]=p->wm_delete_window;

      XSendEvent(p->display, p->window, False, 0, &event);
      XFlush(p->display);
    }

    pthread_mutex_unlock(&(p->mutex));
  }
}